

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_MemSaveCut(Lf_Mem_t *p,Lf_Cut_t *pCut,int iObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uchar *pBuffer;
  void *local_48;
  int local_34;
  int iCur;
  int Prev;
  int iPlace;
  int i;
  uchar *pPlace;
  int iObj_local;
  Lf_Cut_t *pCut_local;
  Lf_Mem_t *p_local;
  
  uVar1 = p->iCur;
  if ((*(uint *)&pCut->field_0x14 >> 0x17 & 1) != 0) {
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x211,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  iVar3 = Vec_PtrSize(&p->vPages);
  if (iVar3 == p->iCur >> ((byte)p->LogPage & 0x1f)) {
    iVar3 = Vec_PtrSize(p->vFree);
    if (iVar3 == 0) {
      local_48 = malloc((long)(p->MaskPage + 1));
    }
    else {
      local_48 = Vec_PtrPop(p->vFree);
    }
    Vec_PtrPush(&p->vPages,local_48);
  }
  if (0x37 < p->MaskPage - (p->iCur & p->MaskPage)) {
    uVar2 = p->MaskPage;
    pBuffer = (uchar *)Vec_PtrEntry(&p->vPages,p->iCur >> ((byte)p->LogPage & 0x1f));
    iCur = Gia_AigerWriteUnsignedBuffer(pBuffer,uVar1 & uVar2,*(uint *)&pCut->field_0x14 >> 0x18);
    Prev = *(uint *)&pCut->field_0x14 >> 0x18;
    local_34 = iObj;
    while (Prev = Prev - 1, -1 < Prev) {
      iCur = Gia_AigerWriteUnsignedBuffer
                       (pBuffer,iCur,local_34 - *(int *)((long)&pCut[1].Sign + (long)Prev * 4));
      local_34 = *(int *)((long)&pCut[1].Sign + (long)Prev * 4);
    }
    if ((*(uint *)&pCut->field_0x14 >> 0x18 < 2) && (3 < pCut->iFunc)) {
      __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                    ,0x21a,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
    }
    if (-1 < pCut->iFunc) {
      iCur = Gia_AigerWriteUnsignedBuffer(pBuffer,iCur,pCut->iFunc);
    }
    if (p->MaskPage - (iCur & p->MaskPage) < 0x38) {
      p->iCur = (p->iCur >> ((byte)p->LogPage & 0x1f)) + 1 << ((byte)p->LogPage & 0x1f);
    }
    else {
      p->iCur = p->iCur & (p->MaskPage ^ 0xffffffffU) | iCur;
    }
    return uVar1;
  }
  __assert_fail("p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x214,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
}

Assistant:

static inline int Lf_MemSaveCut( Lf_Mem_t * p, Lf_Cut_t * pCut, int iObj )
{
    unsigned char * pPlace;
    int i, iPlace, Prev = iObj, iCur = p->iCur;
    assert( !pCut->fMux7 );
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> p->LogPage) )
        Vec_PtrPush( &p->vPages, Vec_PtrSize(p->vFree) ? Vec_PtrPop(p->vFree) : ABC_ALLOC(char,p->MaskPage+1) );
    assert( p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2) );
    iPlace = iCur & p->MaskPage;
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, p->iCur >> p->LogPage);
    iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->nLeaves );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, Prev - pCut->pLeaves[i] ), Prev = pCut->pLeaves[i];
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( pCut->iFunc >= 0 )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->iFunc );
    if ( p->MaskPage - (iPlace & p->MaskPage) < 4 * (LF_LEAF_MAX + 2) )
        p->iCur = ((p->iCur >> p->LogPage) + 1) << p->LogPage;
    else
        p->iCur = (p->iCur & ~p->MaskPage) | iPlace;
    return iCur;
}